

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

double __thiscall icu_63::Calendar::computeMillisInDay(Calendar *this)

{
  int iVar1;
  int32_t iVar2;
  int32_t iVar3;
  int32_t iVar4;
  int local_38;
  int local_34;
  int32_t bestStamp;
  int32_t hourStamp;
  int32_t hourOfDayStamp;
  double millisInDay;
  Calendar *this_local;
  
  _hourStamp = 0.0;
  iVar1 = this->fStamp[0xb];
  if (this->fStamp[9] < this->fStamp[10]) {
    local_34 = this->fStamp[10];
  }
  else {
    local_34 = this->fStamp[9];
  }
  local_38 = iVar1;
  if (iVar1 < local_34) {
    local_38 = local_34;
  }
  if (local_38 != 0) {
    if (local_38 == iVar1) {
      iVar2 = internalGet(this,UCAL_HOUR_OF_DAY);
      _hourStamp = (double)iVar2 + 0.0;
    }
    else {
      iVar2 = internalGet(this,UCAL_HOUR);
      iVar3 = internalGet(this,UCAL_AM_PM);
      _hourStamp = (double)(iVar3 * 0xc) + (double)iVar2 + 0.0;
    }
  }
  iVar2 = internalGet(this,UCAL_MINUTE);
  iVar3 = internalGet(this,UCAL_SECOND);
  iVar4 = internalGet(this,UCAL_MILLISECOND);
  return (double)iVar4 + ((double)iVar3 + ((double)iVar2 + _hourStamp * 60.0) * 60.0) * 1000.0;
}

Assistant:

double Calendar::computeMillisInDay() {
  // Do the time portion of the conversion.

    double millisInDay = 0;

    // Find the best set of fields specifying the time of day.  There
    // are only two possibilities here; the HOUR_OF_DAY or the
    // AM_PM and the HOUR.
    int32_t hourOfDayStamp = fStamp[UCAL_HOUR_OF_DAY];
    int32_t hourStamp = (fStamp[UCAL_HOUR] > fStamp[UCAL_AM_PM])?fStamp[UCAL_HOUR]:fStamp[UCAL_AM_PM];
    int32_t bestStamp = (hourStamp > hourOfDayStamp) ? hourStamp : hourOfDayStamp;

    // Hours
    if (bestStamp != kUnset) {
        if (bestStamp == hourOfDayStamp) {
            // Don't normalize here; let overflow bump into the next period.
            // This is consistent with how we handle other fields.
            millisInDay += internalGet(UCAL_HOUR_OF_DAY);
        } else {
            // Don't normalize here; let overflow bump into the next period.
            // This is consistent with how we handle other fields.
            millisInDay += internalGet(UCAL_HOUR);
            millisInDay += 12 * internalGet(UCAL_AM_PM); // Default works for unset AM_PM
        }
    }

    // We use the fact that unset == 0; we start with millisInDay
    // == HOUR_OF_DAY.
    millisInDay *= 60;
    millisInDay += internalGet(UCAL_MINUTE); // now have minutes
    millisInDay *= 60;
    millisInDay += internalGet(UCAL_SECOND); // now have seconds
    millisInDay *= 1000;
    millisInDay += internalGet(UCAL_MILLISECOND); // now have millis

    return millisInDay;
}